

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O2

void foreach_source_inner
               (CManager_conflict cm,EVstone to_stone,char *seen,ForeachSourceCB cb,
               source_info *info)

{
  int iVar1;
  event_path_data evp;
  CMConnection_conflict p_Var2;
  _proto_action *p_Var3;
  int iVar4;
  stone_type p_Var5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  int local_70;
  
  evp = cm->evp;
  iVar4 = evp->stone_base_num;
  for (local_70 = iVar4; local_70 < iVar4 + evp->stone_count; local_70 = local_70 + 1) {
    p_Var5 = stone_struct(evp,local_70);
    lVar7 = (long)local_70;
    if ((p_Var5 != (stone_type)0x0 && seen[lVar7 - evp->stone_base_num] == '\0') &&
       (p_Var5->local_id != -1)) {
      if (local_70 == to_stone) {
        p_Var2 = p_Var5->last_remote_source;
        if (p_Var2 != (CMConnection_conflict)0x0) {
          *(undefined4 *)(cb + 0x10) = 1;
          *(EVstone *)(cb + 0x14) = to_stone;
          *(CMConnection_conflict *)(cb + 0x18) = p_Var2;
          backpressure_set_one(cm,(source_info *)cb);
        }
      }
      else {
        iVar4 = p_Var5->is_stalled;
        uVar8 = 0;
        uVar6 = (ulong)(uint)p_Var5->output_count;
        if (p_Var5->output_count < 1) {
          uVar6 = uVar8;
        }
        iVar12 = 0;
        iVar13 = 0;
        for (; uVar6 != uVar8; uVar8 = uVar8 + 1) {
          uVar9 = (uint)(p_Var5->output_stone_ids[uVar8] == to_stone);
          iVar12 = iVar12 + uVar9;
          iVar13 = iVar13 + uVar9;
        }
        lVar10 = 0x28;
        for (lVar11 = 0; lVar11 < p_Var5->proto_action_count; lVar11 = lVar11 + 1) {
          p_Var3 = p_Var5->proto_actions;
          iVar1 = *(int *)((long)p_Var3 + lVar10 + -0x28);
          if (iVar1 == 4) {
            if (*(int *)((long)&p_Var3->action_type + lVar10) == to_stone) {
              iVar12 = iVar12 + 1;
              iVar13 = iVar13 + 1;
            }
          }
          else if (iVar1 == 10) {
            iVar12 = iVar12 + (uint)(*(int *)((long)p_Var3 + lVar10 + -0x10) == to_stone);
          }
          if (iVar12 != 0) {
            *(undefined4 *)(cb + 0x10) = 0;
            *(int *)(cb + 0x14) = local_70;
            *(int *)(cb + 0x18) = (int)lVar11;
            *(int *)(cb + 0x1c) = iVar13;
            backpressure_set_one(cm,(source_info *)cb);
          }
          if ((iVar4 == 0) && (iVar13 != 0)) {
            seen[lVar7 - evp->stone_base_num] = '\x01';
            foreach_source_inner(cm,local_70,seen,cb,info);
            seen[lVar7 - evp->stone_base_num] = '\0';
          }
          lVar10 = lVar10 + 0x60;
        }
      }
    }
    iVar4 = evp->stone_base_num;
  }
  return;
}

Assistant:

static void
foreach_source_inner(CManager cm, EVstone to_stone, char *seen,
        ForeachSourceCB cb, struct source_info *info) {
    event_path_data evp = cm->evp;
    EVstone cur_stone;
    for (cur_stone = evp->stone_base_num; cur_stone < evp->stone_count + evp->stone_base_num; ++cur_stone) {
        EVaction cur_action;
        stone_type stone = stone_struct(evp, cur_stone);
        if (seen[cur_stone - evp->stone_base_num]) continue;
	if (!stone) continue;
        if (stone->local_id == -1) continue;
        if (cur_stone == to_stone) {
            if (stone->last_remote_source != NULL) {
                info->type = SOURCE_REMOTE;
                info->stone = cur_stone;
                info->u.remote.conn = stone->last_remote_source;
                cb(cm, info);
            }
        } else {
            int was_stalled = stone->is_stalled;
	    int i;
	    int matches = 0;
	    int matches_recursive = 0;
	    for (i = 0; i < stone->output_count; ++i) {
		if (to_stone == stone->output_stone_ids[i]) {
		    ++matches;
		    ++matches_recursive;
		}
	    }
            for (cur_action = 0; cur_action < stone->proto_action_count; ++cur_action) {
                proto_action *act;
                act = &stone->proto_actions[cur_action];
                switch (act->action_type) {
                case Action_Store:
                    if (act->o.store.target_stone_id == to_stone) {
                        ++matches;
                    }
                    break;
                case Action_Split:
                    break;
                case Action_Filter:
                    if (to_stone == act->o.term.target_stone_id) {
                        ++matches;
                        ++matches_recursive;
                    }
                    break;
                case Action_Immediate:
                    break;
                case Action_Terminal:
                    /* nothing to do */
                    break;
                default: ;
                    /* printf("source searching: unhandled type %d\n", act->action_type); */
                    /* TODO unhandled cases
                            - Source handles?
                     */
                }
                if (matches) {
                    info->type = SOURCE_ACTION;
                    info->stone = cur_stone;
                    info->u.action.action = cur_action;
                    info->u.action.would_recurse = matches_recursive;
                    cb(cm, info);
                }
                /* If a stone is stalled, conceptually no traffic is going to it.
                 * Note that the only way we should be trying to recurse through
                 * a stalled stone is if it were manually stalled.
                 */
                if (!was_stalled && matches_recursive) {
                    /* avoid infinite recursion */
                    seen[cur_stone - evp->stone_base_num] = 1;
                    foreach_source_inner(cm, cur_stone, seen, cb, info);
                    seen[cur_stone - evp->stone_base_num] = 0; /* XXX */
                }
            }
        }
    }
}